

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cpp
# Opt level: O0

void __thiscall sf2cute::SoundFontWriter::Write(SoundFontWriter *this,ostream *out)

{
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
  local_a8;
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
  local_a0;
  unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>
  local_98 [3];
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  RIFF riff;
  ostream *out_local;
  SoundFontWriter *this_local;
  
  riff.chunks_.
  super__Vector_base<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)out;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"sfbk",&local_79);
  RIFF::RIFF((RIFF *)local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  MakeInfoListChunk((SoundFontWriter *)local_98);
  RIFF::AddChunk((RIFF *)local_58,local_98);
  std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>::
  ~unique_ptr(local_98);
  MakeSdtaListChunk((SoundFontWriter *)&local_a0);
  RIFF::AddChunk((RIFF *)local_58,&local_a0);
  std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>::
  ~unique_ptr(&local_a0);
  MakePdtaListChunk((SoundFontWriter *)&local_a8);
  RIFF::AddChunk((RIFF *)local_58,&local_a8);
  std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>::
  ~unique_ptr(&local_a8);
  RIFF::Write((RIFF *)local_58,
              (ostream *)
              riff.chunks_.
              super__Vector_base<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>,_std::allocator<std::unique_ptr<sf2cute::RIFFChunkInterface,_std::default_delete<sf2cute::RIFFChunkInterface>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  RIFF::~RIFF((RIFF *)local_58);
  return;
}

Assistant:

void SoundFontWriter::Write(std::ostream & out) {
  RIFF riff("sfbk");
  riff.AddChunk(MakeInfoListChunk());
  riff.AddChunk(MakeSdtaListChunk());
  riff.AddChunk(MakePdtaListChunk());
  riff.Write(out);
}